

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void GetNodeFunctions(ExpressionContext *ctx,SynBase *source,ExprBase *function,
                     SmallArray<FunctionValue,_32U> *functions)

{
  FunctionValue *pFVar1;
  uint uVar2;
  SynBase *pSVar3;
  ExprBase *pEVar4;
  SynBase *pSVar5;
  FunctionData *pFVar6;
  _func_int **pp_Var7;
  ExprShortFunctionOverloadSet *node;
  
  if (function == (ExprBase *)0x0) {
    return;
  }
  uVar2 = function->typeID;
  if (uVar2 == 0xe) {
    function = (ExprBase *)function[1]._vptr_ExprBase;
    if (function == (ExprBase *)0x0) {
      return;
    }
    uVar2 = function->typeID;
  }
  switch(uVar2) {
  case 0x24:
  case 0x25:
    pSVar5 = function->source;
    pFVar6 = (FunctionData *)function[1]._vptr_ExprBase;
    pSVar3 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    pEVar4 = CreateFunctionContextAccess(ctx,pSVar3,(FunctionData *)function[1]._vptr_ExprBase);
    if (pEVar4 == (ExprBase *)0x0) {
LAB_0014a79b:
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                    ,0x289,"FunctionValue::FunctionValue(SynBase *, FunctionData *, ExprBase *)");
    }
    goto LAB_0014a6b8;
  case 0x26:
    pEVar4 = *(ExprBase **)&function[1].typeID;
    if (pEVar4 == (ExprBase *)0x0) goto LAB_0014a79b;
    pSVar5 = function->source;
    pFVar6 = (FunctionData *)function[1]._vptr_ExprBase;
LAB_0014a6b8:
    if (functions->count == functions->max) {
      SmallArray<FunctionValue,_32U>::grow(functions,functions->count);
    }
    pFVar1 = functions->data;
    if (pFVar1 == (FunctionValue *)0x0) {
LAB_0014a77c:
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<FunctionValue, 32>::push_back(const T &) [T = FunctionValue, N = 32]"
                   );
    }
    uVar2 = functions->count;
    functions->count = uVar2 + 1;
    pFVar1[uVar2].source = pSVar5;
    pFVar1[uVar2].function = pFVar6;
    pFVar1[uVar2].context = pEVar4;
    break;
  case 0x27:
    for (pp_Var7 = function[1]._vptr_ExprBase; pp_Var7 != (_func_int **)0x0;
        pp_Var7 = (_func_int **)pp_Var7[1]) {
      pSVar5 = function[1].source;
      if (pSVar5 == (SynBase *)0x0) {
        pSVar5 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
        pSVar5 = (SynBase *)CreateFunctionContextAccess(ctx,pSVar5,(FunctionData *)*pp_Var7);
        if (pSVar5 == (SynBase *)0x0) goto LAB_0014a79b;
      }
      pSVar3 = function->source;
      pFVar6 = (FunctionData *)*pp_Var7;
      if (functions->count == functions->max) {
        SmallArray<FunctionValue,_32U>::grow(functions,functions->count);
      }
      pFVar1 = functions->data;
      if (pFVar1 == (FunctionValue *)0x0) goto LAB_0014a77c;
      uVar2 = functions->count;
      functions->count = uVar2 + 1;
      pFVar1[uVar2].source = pSVar3;
      pFVar1[uVar2].function = pFVar6;
      pFVar1[uVar2].context = (ExprBase *)pSVar5;
    }
    break;
  case 0x28:
    for (pp_Var7 = function[1]._vptr_ExprBase; pp_Var7 != (_func_int **)0x0;
        pp_Var7 = (_func_int **)pp_Var7[2]) {
      pEVar4 = (ExprBase *)pp_Var7[1];
      if (pEVar4 == (ExprBase *)0x0) goto LAB_0014a79b;
      pSVar5 = function->source;
      pFVar6 = (FunctionData *)*pp_Var7;
      if (functions->count == functions->max) {
        SmallArray<FunctionValue,_32U>::grow(functions,functions->count);
      }
      pFVar1 = functions->data;
      if (pFVar1 == (FunctionValue *)0x0) goto LAB_0014a77c;
      uVar2 = functions->count;
      functions->count = uVar2 + 1;
      pFVar1[uVar2].source = pSVar5;
      pFVar1[uVar2].function = pFVar6;
      pFVar1[uVar2].context = pEVar4;
    }
  }
  return;
}

Assistant:

void GetNodeFunctions(ExpressionContext &ctx, SynBase *source, ExprBase *function, SmallArray<FunctionValue, 32> &functions)
{
	if(ExprPassthrough *node = getType<ExprPassthrough>(function))
		function = node->value;

	if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(function))
	{
		functions.push_back(FunctionValue(node->source, node->function, node->context));
	}
	else if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(function))
	{
		functions.push_back(FunctionValue(node->source, node->function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), node->function)));
	}
	else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(function))
	{
		functions.push_back(FunctionValue(node->source, node->function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), node->function)));
	}
	else if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(function))
	{
		for(FunctionHandle *arg = node->functions.head; arg; arg = arg->next)
		{
			ExprBase *context = node->context;

			if(!context)
				context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), arg->function);

			functions.push_back(FunctionValue(node->source, arg->function, context));
		}
	}
	else if(ExprShortFunctionOverloadSet *node = getType<ExprShortFunctionOverloadSet>(function))
	{
		for(ShortFunctionHandle *option = node->functions.head; option; option = option->next)
			functions.push_back(FunctionValue(node->source, option->function, option->context));
	}
}